

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O2

xmlXIncludeCtxtPtr xmlXIncludeNewContext(xmlDocPtr doc)

{
  xmlXIncludeCtxtPtr pxVar1;
  
  if (doc != (xmlDocPtr)0x0) {
    pxVar1 = (xmlXIncludeCtxtPtr)(*xmlMalloc)(0x88);
    if (pxVar1 == (xmlXIncludeCtxtPtr)0x0) {
      pxVar1 = (xmlXIncludeCtxtPtr)0x0;
    }
    else {
      pxVar1->resourceLoader = (xmlResourceLoader)0x0;
      pxVar1->resourceCtxt = (void *)0x0;
      pxVar1->errorHandler = (xmlStructuredErrorFunc)0x0;
      pxVar1->errorCtxt = (void *)0x0;
      pxVar1->depth = 0;
      pxVar1->isStream = 0;
      pxVar1->xpctxt = (xmlXPathContextPtr)0x0;
      *(undefined8 *)&pxVar1->parseFlags = 0;
      pxVar1->_private = (void *)0x0;
      pxVar1->nbErrors = 0;
      pxVar1->fatalErr = 0;
      pxVar1->errNo = 0;
      pxVar1->legacy = 0;
      pxVar1->urlNr = 0;
      pxVar1->urlMax = 0;
      pxVar1->urlTab = (xmlXIncludeDoc *)0x0;
      pxVar1->txtNr = 0;
      pxVar1->txtMax = 0;
      pxVar1->txtTab = (xmlXIncludeTxt *)0x0;
      pxVar1->doc = doc;
      pxVar1->incNr = 0;
      pxVar1->incMax = 0;
      pxVar1->incTab = (xmlXIncludeRefPtr *)0x0;
    }
    return pxVar1;
  }
  return (xmlXIncludeCtxtPtr)0x0;
}

Assistant:

xmlXIncludeCtxtPtr
xmlXIncludeNewContext(xmlDocPtr doc) {
    xmlXIncludeCtxtPtr ret;

    if (doc == NULL)
	return(NULL);
    ret = (xmlXIncludeCtxtPtr) xmlMalloc(sizeof(xmlXIncludeCtxt));
    if (ret == NULL)
	return(NULL);
    memset(ret, 0, sizeof(xmlXIncludeCtxt));
    ret->doc = doc;
    ret->incNr = 0;
    ret->incMax = 0;
    ret->incTab = NULL;
    ret->nbErrors = 0;
    return(ret);
}